

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O0

void cff_decoder_init(CFF_Decoder *decoder,TT_Face face,CFF_Size size,CFF_GlyphSlot slot,
                     FT_Bool hinting,FT_Render_Mode hint_mode,
                     CFF_Decoder_Get_Glyph_Callback get_callback,
                     CFF_Decoder_Free_Glyph_Callback free_callback)

{
  CFF_Font_conflict pCVar1;
  FT_Int FVar2;
  CFF_Font_conflict cff;
  FT_Render_Mode hint_mode_local;
  FT_Bool hinting_local;
  CFF_GlyphSlot slot_local;
  CFF_Size size_local;
  TT_Face face_local;
  CFF_Decoder *decoder_local;
  
  pCVar1 = (CFF_Font_conflict)(face->extra).data;
  memset(decoder,0,0x5f0);
  cff_builder_init(&decoder->builder,face,size,slot,hinting);
  decoder->cff = pCVar1;
  decoder->num_globals = (pCVar1->global_subrs_index).count;
  decoder->globals = pCVar1->global_subrs;
  FVar2 = cff_compute_bias((pCVar1->top_font).font_dict.charstring_type,decoder->num_globals);
  decoder->globals_bias = FVar2;
  decoder->hint_mode = hint_mode;
  decoder->get_glyph_callback = get_callback;
  decoder->free_glyph_callback = free_callback;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_decoder_init( CFF_Decoder*                     decoder,
                    TT_Face                          face,
                    CFF_Size                         size,
                    CFF_GlyphSlot                    slot,
                    FT_Bool                          hinting,
                    FT_Render_Mode                   hint_mode,
                    CFF_Decoder_Get_Glyph_Callback   get_callback,
                    CFF_Decoder_Free_Glyph_Callback  free_callback )
  {
    CFF_Font  cff = (CFF_Font)face->extra.data;


    /* clear everything */
    FT_ZERO( decoder );

    /* initialize builder */
    cff_builder_init( &decoder->builder, face, size, slot, hinting );

    /* initialize Type2 decoder */
    decoder->cff          = cff;
    decoder->num_globals  = cff->global_subrs_index.count;
    decoder->globals      = cff->global_subrs;
    decoder->globals_bias = cff_compute_bias(
                              cff->top_font.font_dict.charstring_type,
                              decoder->num_globals );

    decoder->hint_mode = hint_mode;

    decoder->get_glyph_callback  = get_callback;
    decoder->free_glyph_callback = free_callback;
  }